

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O0

void __thiscall CReg::CReg(CReg *this,UChar *_iso,char *_id)

{
  size_t sVar1;
  int local_24;
  int32_t len;
  char *_id_local;
  UChar *_iso_local;
  CReg *this_local;
  
  this->next = (CReg *)0x0;
  sVar1 = strlen(_id);
  local_24 = (int)sVar1;
  if (0x9c < local_24) {
    local_24 = 0x9c;
  }
  strncpy(this->id,_id,(long)local_24);
  this->id[local_24] = '\0';
  u_memcpy_63(this->iso,_iso,3);
  this->iso[3] = L'\0';
  return;
}

Assistant:

CReg(const UChar* _iso, const char* _id)
        : next(0)
    {
        int32_t len = (int32_t)uprv_strlen(_id);
        if (len > (int32_t)(sizeof(id)-1)) {
            len = (sizeof(id)-1);
        }
        uprv_strncpy(id, _id, len);
        id[len] = 0;
        u_memcpy(iso, _iso, ISO_CURRENCY_CODE_LENGTH);
        iso[ISO_CURRENCY_CODE_LENGTH] = 0;
    }